

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O3

unique_pointer<const_pstore::repo::fragment> __thiscall
pstore::database::getrou<pstore::repo::fragment,void>
          (database *this,extent<pstore::repo::fragment> *ex)

{
  ulong *in_RDX;
  _Head_base<0UL,_const_pstore::repo::fragment_*,_false> extraout_RDX;
  unique_pointer<const_pstore::repo::fragment> uVar1;
  _func_int **local_28;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Stack_20;
  
  if ((*in_RDX & 0xf) == 0) {
    (**(code **)((ex->addr).a_.a_ + 0x18))(&local_28,ex,*in_RDX,in_RDX[1],1);
    this->_vptr_database = local_28;
    (this->storage_).sat_._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         _Stack_20._M_head_impl;
    uVar1._M_t.
    super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>.
    _M_t.
    super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>
    .super__Head_base<0UL,_const_pstore::repo::fragment_*,_false>._M_head_impl =
         extraout_RDX._M_head_impl;
    uVar1._M_t.
    super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>.
    _M_t.
    super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>
    .super__Tuple_impl<1UL,_void_(*)(const_pstore::repo::fragment_*)>.
    super__Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>)
         (_Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>)this;
    return (unique_pointer<const_pstore::repo::fragment>)
           uVar1._M_t.
           super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>
           ._M_t.
           super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>
    ;
  }
  raise<pstore::error_code>(bad_alignment);
}

Assistant:

auto database::getrou (extent<T> const & ex) const -> unique_pointer<T const> {
        if (ex.addr.to_address ().absolute () % alignof (T) != 0) {
            raise (error_code::bad_alignment);
        }
        // ex.size specifies the size in bytes of the data to be loaded, not the number of elements
        // of type T. For this reason we call the plain address version of getro().
        return unique_pointer_cast<T const> (this->getrou (ex.addr.to_address (), ex.size));
    }